

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkConstructFromCnf(Abc_Ntk_t *pNtk,Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  Cnf_Cut_t *pCut_00;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Vec_Int_t *vCover_00;
  void *pvVar5;
  uint *puVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  bool bVar10;
  int local_64;
  int nDupGates;
  int k;
  int i;
  uint uTruth;
  Vec_Int_t *vCover;
  Cnf_Cut_t *pCut;
  Aig_Obj_t *pLeaf;
  Aig_Obj_t *pObj;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vMapped_local;
  Cnf_Man_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar3 = Abc_NtkCreateNodeConst1(pNtk_00);
  pAVar4 = Aig_ManConst1(p->pManAig);
  (pAVar4->field_5).pData = pAVar3;
  for (nDupGates = 0; iVar2 = Abc_NtkCiNum(pNtk), nDupGates < iVar2; nDupGates = nDupGates + 1) {
    pAVar3 = Abc_NtkCi(pNtk,nDupGates);
    aVar1 = pAVar3->field_6;
    pAVar4 = Aig_ManCi(p->pManAig,nDupGates);
    pAVar4->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)aVar1;
  }
  vCover_00 = Vec_IntAlloc(0x10000);
  for (nDupGates = 0; iVar2 = Vec_PtrSize(vMapped), nDupGates < iVar2; nDupGates = nDupGates + 1) {
    pvVar5 = Vec_PtrEntry(vMapped,nDupGates);
    pAVar3 = Abc_NtkCreateNode(pNtk_00);
    pCut_00 = *(Cnf_Cut_t **)((long)pvVar5 + 0x28);
    local_64 = 0;
    while( true ) {
      bVar10 = false;
      if (local_64 < pCut_00->nFanins) {
        pCut = (Cnf_Cut_t *)
               Aig_ManObj(p->pManAig,*(int *)((long)pCut_00[1].vIsop + (long)local_64 * 4 + -8));
        bVar10 = (Aig_Obj_t *)pCut != (Aig_Obj_t *)0x0;
      }
      if (!bVar10) break;
      Abc_ObjAddFanin(pAVar3,(Abc_Obj_t *)pCut[1].vIsop[1]);
      local_64 = local_64 + 1;
    }
    if (pCut_00->nFanins < '\x05') {
      puVar6 = Cnf_CutTruth(pCut_00);
      Cnf_SopConvertToVector
                (p->pSops[*puVar6 & 0xffff],(int)p->pSopSizes[*puVar6 & 0xffff],vCover_00);
      pcVar7 = Abc_SopCreateFromIsop
                         ((Mem_Flex_t *)pNtk_00->pManFunc,(int)pCut_00->nFanins,vCover_00);
      (pAVar3->field_5).pData = pcVar7;
    }
    else {
      pcVar7 = Abc_SopCreateFromIsop
                         ((Mem_Flex_t *)pNtk_00->pManFunc,(int)pCut_00->nFanins,pCut_00->vIsop[1]);
      (pAVar3->field_5).pData = pcVar7;
    }
    *(Abc_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  Vec_IntFree(vCover_00);
  for (nDupGates = 0; iVar2 = Abc_NtkCoNum(pNtk), nDupGates < iVar2; nDupGates = nDupGates + 1) {
    pAVar8 = Abc_NtkCo(pNtk,nDupGates);
    pAVar4 = Aig_ManCo(p->pManAig,nDupGates);
    pAVar9 = Aig_ObjFanin0(pAVar4);
    pAVar3 = (Abc_Obj_t *)(pAVar9->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar4);
    pAVar3 = Abc_ObjNotCond(pAVar3,iVar2);
    Abc_ObjAddFanin((pAVar8->field_6).pCopy,pAVar3);
  }
  pAVar4 = Aig_ManConst1(p->pManAig);
  pAVar3 = (Abc_Obj_t *)(pAVar4->field_5).pData;
  iVar2 = Abc_ObjFanoutNum(pAVar3);
  if (iVar2 == 0) {
    Abc_NtkDeleteObj(pAVar3);
  }
  Abc_NtkLogicMakeSimpleCos(pNtk_00,1);
  iVar2 = Abc_NtkCheck(pNtk_00);
  if (iVar2 == 0) {
    Abc_Print(1,"Abc_NtkConstructFromCnf(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkConstructFromCnf( Abc_Ntk_t * pNtk, Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    Aig_Obj_t * pObj, * pLeaf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover;
    unsigned uTruth;
    int i, k, nDupGates;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // make the mapper point to the new network
    Aig_ManConst1(p->pManAig)->pData = Abc_NtkCreateNodeConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pNode, i )
        Aig_ManCi(p->pManAig, i)->pData = pNode->pCopy;
    // process the nodes in topological order
    vCover = Vec_IntAlloc( 1 << 16 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // create new node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        // add fanins according to the cut
        pCut = (Cnf_Cut_t *)pObj->pData;
        Cnf_CutForEachLeaf( p->pManAig, pCut, pLeaf, k )
            Abc_ObjAddFanin( pNodeNew, (Abc_Obj_t *)pLeaf->pData );
        // add logic function
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vCover );
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, vCover );
        }
        else
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, pCut->vIsop[1] );
        // save the node
        pObj->pData = pNodeNew;
    }
    Vec_IntFree( vCover );
    // add the CO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pObj = Aig_ManCo(p->pManAig, i);
        pNodeNew = Abc_ObjNotCond( (Abc_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }

    // remove the constant node if not used
    pNodeNew = (Abc_Obj_t *)Aig_ManConst1(p->pManAig)->pData;
    if ( Abc_ObjFanoutNum(pNodeNew) == 0 )
        Abc_NtkDeleteObj( pNodeNew );
    // minimize the node
//    Abc_NtkSweep( pNtkNew, 0 );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
//    if ( nDupGates && If_ManReadVerbose(pIfMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkConstructFromCnf(): Network check has failed.\n" );
    return pNtkNew;
}